

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O3

RDL_cfURF * RDL_findCycleFams(RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  RDL_cfURF *__ptr;
  void *__ptr_00;
  ulong uVar5;
  RDL_cfam *pRVar6;
  char *pcVar7;
  RDL_cfam **ppRVar8;
  uint uVar9;
  uint *puVar10;
  uint r;
  long lVar11;
  uint y;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  RDL_cfam **local_a0;
  RDL_cfam **local_70;
  RDL_cfam **local_68;
  ulong local_60;
  void *local_58;
  ulong local_48;
  
  __ptr = (RDL_cfURF *)malloc(0x10);
  __ptr->alloced = 0x40;
  local_a0 = (RDL_cfam **)malloc(0x200);
  __ptr->fams = local_a0;
  __ptr->nofFams = 0;
  uVar9 = gra->V;
  __ptr_00 = malloc((ulong)uVar9 * 4);
  local_68 = local_a0;
  if ((ulong)uVar9 == 0) {
    uVar9 = 0;
  }
  else {
    uVar5 = 1;
    local_60 = 0x40;
    uVar9 = 0;
    uVar14 = 0;
    uVar12 = 0;
    ppRVar8 = local_a0;
    local_70 = local_a0;
    do {
      if ((int)uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar16 = 0;
        do {
          if (spi->reachable[uVar12][uVar16] == '\x01') {
            puVar10 = gra->degree;
            uVar5 = (ulong)puVar10[uVar16];
            if (puVar10[uVar16] != 0) {
              uVar17 = 0;
              uVar15 = 0;
              do {
                uVar1 = gra->adjList[uVar16][uVar17][0];
                uVar13 = (ulong)uVar1;
                r = (uint)uVar12;
                y = (uint)uVar16;
                if (spi->reachable[uVar12][uVar13] == '\x01') {
                  uVar2 = spi->dist[uVar12][uVar13];
                  uVar3 = spi->dist[uVar12][uVar16];
                  if (uVar2 + 1 == uVar3) {
                    *(uint *)((long)__ptr_00 + uVar15 * 4) = uVar1;
                    uVar15 = (ulong)((int)uVar15 + 1);
                  }
                  else if (uVar2 != uVar3 + 1) {
                    if (((puVar10[uVar13] < (uint)uVar5) ||
                        ((uVar13 < uVar16 && (puVar10[uVar13] == (uint)uVar5)))) &&
                       (iVar4 = RDL_pathsShareOnlyStart(r,y,uVar1,(RDL_graph *)(ulong)gra->V,spi),
                       iVar4 != 0)) {
                      if ((uint)local_60 == uVar14) {
                        local_60 = (ulong)(uVar14 * 2);
                        __ptr->alloced = uVar14 * 2;
                        local_a0 = (RDL_cfam **)realloc(ppRVar8,local_60 * 8);
                        __ptr->fams = local_a0;
                        ppRVar8 = local_a0;
                        local_70 = local_a0;
                        local_68 = local_a0;
                      }
                      if (ppRVar8 == (RDL_cfam **)0x0) {
                        ppRVar8 = (RDL_cfam **)0x0;
                      }
                      else {
                        pRVar6 = (RDL_cfam *)malloc(0x28);
                        pRVar6->r = r;
                        pRVar6->p = y;
                        pRVar6->q = uVar1;
                        pRVar6->x = 0xffffffff;
                        pRVar6->mark = 0;
                        pcVar7 = RDL_findPrototype(r,y,uVar1,0xffffffff,gra,spi);
                        pRVar6->prototype = pcVar7;
                        pRVar6->weight = spi->dist[uVar12][uVar16] + 1 + spi->dist[uVar12][uVar13];
                        uVar9 = uVar14 + 1;
                        __ptr->nofFams = uVar9;
                        local_70[uVar14] = pRVar6;
                        ppRVar8 = local_70;
                        uVar14 = uVar9;
                      }
                    }
                  }
                  if (spi->dist[uVar12][uVar13] == 1) {
                    RDL_addEdge(spi->dPaths[uVar12],uVar1,r);
                  }
                }
                uVar17 = uVar17 + 1;
                puVar10 = gra->degree;
                uVar5 = (ulong)puVar10[uVar16];
              } while (uVar17 < uVar5);
              if ((int)uVar15 != 0) {
                uVar5 = 0;
                local_58 = __ptr_00;
                local_48 = uVar15;
                do {
                  uVar17 = uVar5 + 1;
                  if (uVar17 < uVar15) {
                    uVar1 = *(uint *)((long)__ptr_00 + uVar5 * 4);
                    lVar11 = 1;
                    do {
                      uVar2 = *(uint *)((long)local_58 + lVar11 * 4);
                      iVar4 = RDL_pathsShareOnlyStart(r,uVar1,uVar2,(RDL_graph *)(ulong)gra->V,spi);
                      if (iVar4 != 0) {
                        if ((uint)local_60 == uVar9) {
                          local_60 = (ulong)(uVar9 * 2);
                          __ptr->alloced = uVar9 * 2;
                          local_a0 = (RDL_cfam **)realloc(local_a0,local_60 * 8);
                          __ptr->fams = local_a0;
                          local_68 = local_a0;
                        }
                        if (local_a0 == (RDL_cfam **)0x0) {
                          local_a0 = (RDL_cfam **)0x0;
                          local_70 = (RDL_cfam **)0x0;
                          ppRVar8 = (RDL_cfam **)0x0;
                          uVar14 = uVar9;
                        }
                        else {
                          pRVar6 = (RDL_cfam *)malloc(0x28);
                          pRVar6->r = r;
                          pRVar6->p = uVar1;
                          pRVar6->q = uVar2;
                          pRVar6->x = y;
                          pRVar6->mark = 0;
                          pcVar7 = RDL_findPrototype(r,uVar1,uVar2,y,gra,spi);
                          pRVar6->prototype = pcVar7;
                          pRVar6->weight = spi->dist[uVar12][uVar1] + 2 + spi->dist[uVar12][uVar2];
                          uVar14 = uVar9 + 1;
                          __ptr->nofFams = uVar14;
                          local_68[uVar9] = pRVar6;
                          local_a0 = local_68;
                          local_70 = local_68;
                          ppRVar8 = local_68;
                          uVar9 = uVar14;
                        }
                      }
                      lVar11 = lVar11 + 1;
                    } while ((int)local_48 != (int)lVar11);
                  }
                  local_48 = local_48 - 1;
                  local_58 = (void *)((long)local_58 + 4);
                  uVar5 = uVar17;
                } while (uVar17 != uVar15);
                uVar5 = 0;
                do {
                  RDL_addEdge(spi->dPaths[uVar12],y,*(uint *)((long)__ptr_00 + uVar5 * 4));
                  uVar5 = uVar5 + 1;
                } while (uVar15 != uVar5);
              }
            }
          }
          uVar16 = uVar16 + 1;
          uVar5 = (ulong)gra->V;
        } while (uVar16 < uVar5);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar5);
  }
  free(__ptr_00);
  if (local_68 == (RDL_cfam **)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"Graph is too large, can\'t allocate memory!\n");
    free(__ptr);
    __ptr = (RDL_cfURF *)0x0;
  }
  else {
    __ptr->alloced = uVar9;
    ppRVar8 = (RDL_cfam **)realloc(local_68,(ulong)uVar9 * 8);
    __ptr->fams = ppRVar8;
    qsort(ppRVar8,(ulong)uVar9,8,RDL_cycleFamsComp);
  }
  return __ptr;
}

Assistant:

RDL_cfURF *RDL_findCycleFams(RDL_graph *gra, RDL_sPathInfo *spi)
{
  RDL_cfURF *rc = malloc(sizeof(*rc));
  /*number of CFs is at most 2m^2+vn (Vismara Lemma 3)*/

  rc->alloced = 64;
  rc->fams = malloc(rc->alloced * sizeof(*rc->fams));
  rc->nofFams = 0;
  RDL_vismara(rc, gra, spi);

  if (!rc->fams) {
    RDL_outputFunc(RDL_ERROR, "Graph is too large, can't allocate memory!\n");
    free(rc);
    return NULL;
  }

  rc->alloced = rc->nofFams;
  rc->fams = realloc(rc->fams, rc->alloced * sizeof(*rc->fams));

  /* sort by size */
  qsort(rc->fams, rc->nofFams, sizeof(*rc->fams), RDL_cycleFamsComp);
  return rc;
}